

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_parameter.hpp
# Opt level: O0

void __thiscall
ruckig::OutputParameter<3UL,_ruckig::StandardVector>::pass_to_input
          (OutputParameter<3UL,_ruckig::StandardVector> *this,
          InputParameter<3UL,_ruckig::StandardVector> *input)

{
  bool bVar1;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *this_00;
  __normal_iterator<std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  local_28;
  const_iterator local_20;
  InputParameter<3UL,_ruckig::StandardVector> *local_18;
  InputParameter<3UL,_ruckig::StandardVector> *input_local;
  OutputParameter<3UL,_ruckig::StandardVector> *this_local;
  
  (input->current_position)._M_elems[0] = (this->new_position)._M_elems[0];
  (input->current_position)._M_elems[1] = (this->new_position)._M_elems[1];
  (input->current_position)._M_elems[2] = (this->new_position)._M_elems[2];
  (input->current_velocity)._M_elems[0] = (this->new_velocity)._M_elems[0];
  (input->current_velocity)._M_elems[1] = (this->new_velocity)._M_elems[1];
  (input->current_velocity)._M_elems[2] = (this->new_velocity)._M_elems[2];
  (input->current_acceleration)._M_elems[0] = (this->new_acceleration)._M_elems[0];
  (input->current_acceleration)._M_elems[1] = (this->new_acceleration)._M_elems[1];
  (input->current_acceleration)._M_elems[2] = (this->new_acceleration)._M_elems[2];
  if ((this->did_section_change & 1U) != 0) {
    local_18 = input;
    input_local = (InputParameter<3UL,_ruckig::StandardVector> *)this;
    bVar1 = std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::empty
                      (&input->intermediate_positions);
    if (!bVar1) {
      this_00 = &local_18->intermediate_positions;
      local_28._M_current =
           (array<double,_3UL> *)
           std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::begin
                     (&local_18->intermediate_positions);
      __gnu_cxx::
      __normal_iterator<std::array<double,3ul>const*,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
      ::__normal_iterator<std::array<double,3ul>*>
                ((__normal_iterator<std::array<double,3ul>const*,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                  *)&local_20,&local_28);
      std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::erase
                (this_00,local_20);
    }
  }
  return;
}

Assistant:

void pass_to_input(InputParameter<DOFs, CustomVector>& input) const {
        input.current_position = new_position;
        input.current_velocity = new_velocity;
        input.current_acceleration = new_acceleration;

        // Remove first intermediate waypoint if section did change
        if (did_section_change && !input.intermediate_positions.empty()) {
            input.intermediate_positions.erase(input.intermediate_positions.begin());
        }
    }